

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O3

bool COST_SENSITIVE::example_is_test(example *ec)

{
  long lVar1;
  ulong uVar2;
  wclass *pwVar3;
  ulong uVar4;
  
  pwVar3 = (ec->l).cs.costs._begin;
  lVar1 = (long)(ec->l).cs.costs._end - (long)pwVar3;
  if (lVar1 == 0) {
    return true;
  }
  uVar2 = lVar1 >> 4;
  uVar4 = 0;
  while ((pwVar3->x == 3.4028235e+38 && (!NAN(pwVar3->x)))) {
    uVar4 = uVar4 + 1;
    pwVar3 = pwVar3 + 1;
    if (uVar2 + (uVar2 == 0) == uVar4) {
      return uVar2 <= uVar4;
    }
  }
  return false;
}

Assistant:

bool example_is_test(example& ec)
{
  v_array<COST_SENSITIVE::wclass> costs = ec.l.cs.costs;
  if (costs.size() == 0)
    return true;
  for (size_t j = 0; j < costs.size(); j++)
    if (costs[j].x != FLT_MAX)
      return false;
  return true;
}